

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas2.c
# Opt level: O2

int sp_ztrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,doublecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  doublecomplex dVar8;
  doublecomplex dVar9;
  doublecomplex dVar10;
  double dVar11;
  double dVar12;
  doublecomplex dVar13;
  doublecomplex dVar14;
  doublecomplex dVar15;
  doublecomplex dVar16;
  doublecomplex dVar17;
  double dVar18;
  double dVar19;
  long lVar20;
  undefined4 uVar21;
  long lVar22;
  SuperMatrix *pSVar23;
  SuperMatrix *pSVar24;
  double *pdVar25;
  Stype_t *pSVar26;
  ulong uVar27;
  doublecomplex *pdVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  float fVar36;
  int nsupc;
  int nsupr;
  long local_180;
  SuperMatrix *local_178;
  int incx;
  doublecomplex *local_168;
  char *local_160;
  undefined1 local_158 [24];
  long local_140;
  doublecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (*uplo == 'L')) {
    uVar21 = 2;
    iVar29 = -2;
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'U') || (*diag == 'N')) {
        iVar3 = L->nrow;
        uVar21 = 4;
        iVar29 = -4;
        if ((-1 < (long)iVar3) && (iVar3 == L->ncol)) {
          uVar21 = 5;
          iVar29 = -5;
          if ((-1 < U->nrow) && (U->nrow == U->ncol)) {
            pvVar6 = L->Store;
            local_180 = *(long *)((long)pvVar6 + 8);
            pvVar7 = U->Store;
            lVar22 = *(long *)((long)pvVar7 + 8);
            local_178 = U;
            local_160 = trans;
            local_168 = doublecomplexCalloc((long)iVar3);
            if (local_168 == (doublecomplex *)0x0) {
              sprintf((char *)&temp,"%s at line %d in file %s\n",
                      "Malloc fails for work in sp_ztrsv().",0x81,
                      "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zsp_blas2.c"
                     );
              superlu_abort_and_exit((char *)&temp);
            }
            cVar2 = *uplo;
            if (*local_160 == 'T') {
              if (cVar2 == 'L') {
                if (L->nrow == 0) {
                  return 0;
                }
                local_178 = (SuperMatrix *)(local_180 + 8);
                fVar36 = 0.0;
                uVar32 = *(uint *)((long)pvVar6 + 4);
                while (pdVar28 = local_168, -1 < (int)uVar32) {
                  lVar22 = *(long *)((long)pvVar6 + 0x30);
                  local_158._0_4_ = uVar32;
                  uVar27 = (ulong)uVar32;
                  iVar29 = *(int *)(lVar22 + uVar27 * 4);
                  local_160 = (char *)(long)iVar29;
                  iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x20) + (long)local_160 * 4);
                  nsupr = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + (long)local_160 * 4) - iVar3
                  ;
                  nsupc = *(int *)(lVar22 + 4 + uVar27 * 4) - iVar29;
                  lVar33 = *(long *)((long)pvVar6 + 0x10);
                  iVar29 = *(int *)(lVar33 + (long)local_160 * 4);
                  lVar35 = (long)iVar29;
                  iVar4 = *(int *)(lVar22 + 4 + uVar27 * 4);
                  pcVar31 = local_160;
                  while ((long)pcVar31 < (long)iVar4) {
                    pcVar1 = pcVar31 + 1;
                    lVar20 = (long)(iVar29 + nsupc);
                    iVar29 = *(int *)(lVar33 + 4 + (long)pcVar31 * 4);
                    pdVar28 = x + (long)pcVar31;
                    pSVar26 = &local_178->Stype + lVar20 * 4;
                    lVar22 = (long)(iVar3 + nsupc);
                    for (; pcVar31 = pcVar1, lVar20 < iVar29; lVar20 = lVar20 + 1) {
                      dVar18 = x[*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar22 * 4)].r;
                      dVar12 = x[*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar22 * 4)].i;
                      dVar11 = pdVar28->i -
                               (*(double *)(pSVar26 + -2) * dVar12 + dVar18 * *(double *)pSVar26);
                      dVar14.i._0_4_ = SUB84(dVar11,0);
                      dVar14.r = pdVar28->r -
                                 (*(double *)(pSVar26 + -2) * dVar18 + -dVar12 * *(double *)pSVar26)
                      ;
                      dVar14.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                      *pdVar28 = dVar14;
                      lVar22 = lVar22 + 1;
                      pSVar26 = pSVar26 + 4;
                    }
                  }
                  fVar36 = fVar36 + (float)((nsupr - nsupc) * nsupc * 8);
                  if (1 < nsupc) {
                    fVar36 = fVar36 + (float)((nsupc + -1) * nsupc * 4);
                    ztrsv_("L","T","U",&nsupc,(doublecomplex *)(lVar35 * 0x10 + local_180),&nsupr,
                           x + (long)local_160,&incx);
                  }
                  uVar32 = local_158._0_4_ - 1;
                }
              }
              else {
                if (local_178->nrow == 0) {
                  return 0;
                }
                fVar36 = 0.0;
                lVar33 = 0;
                while (pdVar28 = local_168, lVar33 <= *(int *)((long)pvVar6 + 4)) {
                  lVar35 = *(long *)((long)pvVar6 + 0x30);
                  iVar29 = *(int *)(lVar35 + lVar33 * 4);
                  lVar20 = (long)iVar29;
                  nsupr = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + lVar20 * 4) -
                          *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar20 * 4);
                  nsupc = *(int *)(lVar35 + 4 + lVar33 * 4) - iVar29;
                  lVar30 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4);
                  iVar29 = *(int *)(lVar35 + 4 + lVar33 * 4);
                  lVar35 = lVar20;
                  while (lVar35 < iVar29) {
                    iVar3 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar35 * 4);
                    iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar35 * 4);
                    lVar34 = (long)iVar4;
                    pdVar28 = x + lVar35;
                    pdVar25 = (double *)(lVar34 * 0x10 + lVar22 + 8);
                    for (; lVar34 < iVar3; lVar34 = lVar34 + 1) {
                      dVar18 = x[*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar34 * 4)].r;
                      dVar12 = x[*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar34 * 4)].i;
                      dVar11 = pdVar28->i - (pdVar25[-1] * dVar12 + dVar18 * *pdVar25);
                      dVar15.i._0_4_ = SUB84(dVar11,0);
                      dVar15.r = pdVar28->r - (pdVar25[-1] * dVar18 + -dVar12 * *pdVar25);
                      dVar15.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                      *pdVar28 = dVar15;
                      pdVar25 = pdVar25 + 2;
                    }
                    fVar36 = fVar36 + (float)((iVar3 - iVar4) * 8);
                    lVar35 = lVar35 + 1;
                  }
                  fVar36 = fVar36 + (float)((nsupc * 4 + 0xe) * nsupc);
                  if (nsupc == 1) {
                    z_div(x + lVar20,x + lVar20,(doublecomplex *)(lVar30 * 0x10 + local_180));
                    lVar33 = lVar33 + 1;
                  }
                  else {
                    ztrsv_("U","T","N",&nsupc,(doublecomplex *)(lVar30 * 0x10 + local_180),&nsupr,
                           x + lVar20,&incx);
                    lVar33 = lVar33 + 1;
                  }
                }
              }
            }
            else if (*local_160 == 'N') {
              if (cVar2 == 'L') {
                if (L->nrow == 0) {
                  return 0;
                }
                local_160 = (char *)(local_180 + 0x18);
                dVar11 = 0.0;
                dVar18 = 0.0;
                fVar36 = 0.0;
                pSVar23 = (SuperMatrix *)0x0;
                do {
                  local_158._8_4_ = SUB84(dVar18,0);
                  local_158._0_8_ = dVar11;
                  local_158._12_4_ = (int)((ulong)dVar18 >> 0x20);
                  pSVar24 = pSVar23;
                  pdVar28 = local_168;
                  while( true ) {
                    if ((long)*(int *)((long)pvVar6 + 4) < (long)pSVar24) goto LAB_00110988;
                    lVar22 = *(long *)((long)pvVar6 + 0x20);
                    iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x30) + (long)pSVar24 * 4);
                    lVar35 = (long)iVar29;
                    iVar3 = *(int *)(lVar22 + lVar35 * 4);
                    lVar33 = (long)iVar3;
                    nsupr = *(int *)(lVar22 + 4 + lVar35 * 4) - iVar3;
                    pSVar23 = (SuperMatrix *)((long)&pSVar24->Stype + 1);
                    nsupc = *(int *)(*(long *)((long)pvVar6 + 0x30) + 4 + (long)pSVar24 * 4) -
                            iVar29;
                    uVar32 = nsupr - nsupc;
                    iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar35 * 4);
                    fVar36 = (float)(int)(nsupc * uVar32 * 8) +
                             fVar36 + (float)((nsupc * 4 + 6) * nsupc);
                    if (nsupc == 1) break;
                    local_178 = pSVar23;
                    zlsolve(nsupr,nsupc,(doublecomplex *)((long)iVar29 * 0x10 + local_180),
                            x + lVar35);
                    pdVar28 = local_168;
                    zmatvec(nsupr,nsupr - nsupc,nsupc,
                            (doublecomplex *)((long)(nsupc + iVar29) * 0x10 + local_180),x + lVar35,
                            local_168);
                    if ((int)uVar32 < 1) {
                      uVar32 = 0;
                    }
                    for (lVar22 = 0; pSVar24 = local_178, dVar11 = (double)local_158._0_8_,
                        dVar18 = (double)local_158._8_8_, (ulong)uVar32 * 4 != lVar22;
                        lVar22 = lVar22 + 4) {
                      iVar29 = *(int *)(lVar22 + *(long *)((long)pvVar6 + 0x18) +
                                                 (long)(iVar3 + nsupc) * 4);
                      pdVar25 = (double *)((long)&pdVar28->r + lVar22 * 4);
                      dVar11 = x[iVar29].i - pdVar25[1];
                      dVar8.i._0_4_ = SUB84(dVar11,0);
                      dVar8.r = x[iVar29].r - *pdVar25;
                      dVar8.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                      x[iVar29] = dVar8;
                      pdVar25 = (double *)((long)&pdVar28->r + lVar22 * 4);
                      *pdVar25 = (double)local_158._0_8_;
                      pdVar25[1] = (double)local_158._8_8_;
                    }
                  }
                  iVar3 = *(int *)(lVar22 + 4 + lVar35 * 4);
                  pdVar25 = (double *)(local_160 + (long)iVar29 * 0x10);
                  while (lVar33 = lVar33 + 1, lVar33 < iVar3) {
                    iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar33 * 4);
                    dVar18 = x[lVar35].r;
                    dVar12 = x[lVar35].i;
                    dVar11 = pdVar25[-1] * dVar18 + -dVar12 * *pdVar25;
                    dVar18 = pdVar25[-1] * dVar12 + dVar18 * *pdVar25;
                    dVar12 = x[iVar29].i - dVar18;
                    dVar9.i._0_4_ = SUB84(dVar12,0);
                    dVar9.r = x[iVar29].r - dVar11;
                    dVar9.i._4_4_ = (int)((ulong)dVar12 >> 0x20);
                    x[iVar29] = dVar9;
                    pdVar25 = pdVar25 + 2;
                  }
                } while( true );
              }
              if (local_178->nrow == 0) {
                return 0;
              }
              fVar36 = 0.0;
              uVar32 = *(uint *)((long)pvVar6 + 4);
              while (pdVar28 = local_168, -1 < (int)uVar32) {
                local_178 = (SuperMatrix *)CONCAT44(local_178._4_4_,uVar32);
                uVar27 = (ulong)uVar32;
                iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x30) + uVar27 * 4);
                lVar33 = (long)iVar29;
                nsupr = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + lVar33 * 4) -
                        *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar33 * 4);
                nsupc = *(int *)(*(long *)((long)pvVar6 + 0x30) + 4 + uVar27 * 4) - iVar29;
                lVar35 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar33 * 4);
                fVar36 = fVar36 + (float)((nsupc * 4 + 0xe) * nsupc);
                if (nsupc == 1) {
                  pdVar28 = x + lVar33;
                  z_div(pdVar28,pdVar28,(doublecomplex *)(lVar35 * 0x10 + local_180));
                  lVar35 = (long)*(int *)(*(long *)((long)pvVar7 + 0x18) + lVar33 * 4);
                  iVar29 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar33 * 4);
                  pdVar25 = (double *)(lVar35 * 0x10 + lVar22 + 8);
                  for (; lVar35 < iVar29; lVar35 = lVar35 + 1) {
                    iVar3 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar35 * 4);
                    dVar11 = x[iVar3].i - (pdVar25[-1] * pdVar28->i + pdVar28->r * *pdVar25);
                    dVar10.i._0_4_ = SUB84(dVar11,0);
                    dVar10.r = x[iVar3].r - (pdVar25[-1] * pdVar28->r + -pdVar28->i * *pdVar25);
                    dVar10.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                    x[iVar3] = dVar10;
                    pdVar25 = pdVar25 + 2;
                  }
                }
                else {
                  zusolve(nsupr,nsupc,(doublecomplex *)(lVar35 * 0x10 + local_180),x + lVar33);
                  iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x30) + (uVar27 + 1) * 4);
                  while (lVar33 < iVar29) {
                    iVar3 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar33 * 4);
                    iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar33 * 4);
                    lVar35 = (long)iVar4;
                    pdVar25 = (double *)(lVar35 * 0x10 + lVar22 + 8);
                    for (; lVar35 < iVar3; lVar35 = lVar35 + 1) {
                      iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar35 * 4);
                      dVar18 = x[lVar33].r;
                      dVar12 = x[lVar33].i;
                      dVar11 = x[iVar5].i - (pdVar25[-1] * dVar12 + dVar18 * *pdVar25);
                      dVar13.i._0_4_ = SUB84(dVar11,0);
                      dVar13.r = x[iVar5].r - (pdVar25[-1] * dVar18 + -dVar12 * *pdVar25);
                      dVar13.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                      x[iVar5] = dVar13;
                      pdVar25 = pdVar25 + 2;
                    }
                    fVar36 = fVar36 + (float)((iVar3 - iVar4) * 8);
                    lVar33 = lVar33 + 1;
                  }
                }
                uVar32 = (int)local_178 - 1;
              }
            }
            else if (cVar2 == 'L') {
              if (L->nrow == 0) {
                return 0;
              }
              local_178 = (SuperMatrix *)(local_180 + 8);
              fVar36 = 0.0;
              uVar32 = *(uint *)((long)pvVar6 + 4);
              while (pdVar28 = local_168, -1 < (int)uVar32) {
                lVar22 = *(long *)((long)pvVar6 + 0x30);
                local_158._0_4_ = uVar32;
                uVar27 = (ulong)uVar32;
                iVar29 = *(int *)(lVar22 + uVar27 * 4);
                local_140 = (long)iVar29;
                iVar3 = *(int *)(*(long *)((long)pvVar6 + 0x20) + local_140 * 4);
                nsupr = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + local_140 * 4) - iVar3;
                nsupc = *(int *)(lVar22 + 4 + uVar27 * 4) - iVar29;
                lVar33 = *(long *)((long)pvVar6 + 0x10);
                iVar29 = *(int *)(lVar33 + local_140 * 4);
                lVar35 = (long)iVar29;
                iVar4 = *(int *)(lVar22 + 4 + uVar27 * 4);
                lVar22 = local_140;
                while (lVar22 < iVar4) {
                  lVar20 = lVar22 + 1;
                  lVar34 = (long)(iVar29 + nsupc);
                  iVar29 = *(int *)(lVar33 + 4 + lVar22 * 4);
                  pdVar28 = x + lVar22;
                  pSVar26 = &local_178->Stype + lVar34 * 4;
                  lVar30 = (long)(iVar3 + nsupc);
                  for (; lVar22 = lVar20, lVar34 < iVar29; lVar34 = lVar34 + 1) {
                    temp.r = *(double *)(pSVar26 + -2);
                    temp.i = -*(double *)pSVar26;
                    dVar18 = x[*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar30 * 4)].r;
                    dVar12 = x[*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar30 * 4)].i;
                    dVar11 = pdVar28->i - (temp.r * dVar12 + dVar18 * temp.i);
                    dVar16.i._0_4_ = SUB84(dVar11,0);
                    dVar16.r = pdVar28->r - (temp.r * dVar18 + dVar12 * *(double *)pSVar26);
                    dVar16.i._4_4_ = (int)((ulong)dVar11 >> 0x20);
                    *pdVar28 = dVar16;
                    lVar30 = lVar30 + 1;
                    pSVar26 = pSVar26 + 4;
                  }
                }
                fVar36 = fVar36 + (float)((nsupr - nsupc) * nsupc * 8);
                if (1 < nsupc) {
                  fVar36 = fVar36 + (float)((nsupc + -1) * nsupc * 4);
                  ztrsv_("L",local_160,"U",&nsupc,(doublecomplex *)(lVar35 * 0x10 + local_180),
                         &nsupr,x + local_140,&incx);
                }
                uVar32 = local_158._0_4_ - 1;
              }
            }
            else {
              if (local_178->nrow == 0) {
                return 0;
              }
              fVar36 = 0.0;
              lVar33 = 0;
              while (pdVar28 = local_168, lVar33 <= *(int *)((long)pvVar6 + 4)) {
                lVar35 = *(long *)((long)pvVar6 + 0x30);
                iVar29 = *(int *)(lVar35 + lVar33 * 4);
                lVar20 = (long)iVar29;
                nsupr = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 + lVar20 * 4) -
                        *(int *)(*(long *)((long)pvVar6 + 0x20) + lVar20 * 4);
                nsupc = *(int *)(lVar35 + 4 + lVar33 * 4) - iVar29;
                iVar29 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar20 * 4);
                iVar3 = *(int *)(lVar35 + 4 + lVar33 * 4);
                lVar35 = lVar20;
                while (lVar35 < iVar3) {
                  iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar35 * 4);
                  iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar35 * 4);
                  lVar30 = (long)iVar5;
                  pdVar28 = x + lVar35;
                  pdVar25 = (double *)(lVar30 * 0x10 + lVar22 + 8);
                  for (; lVar30 < iVar4; lVar30 = lVar30 + 1) {
                    temp.r = pdVar25[-1];
                    dVar11 = *pdVar25;
                    temp.i = -dVar11;
                    dVar12 = x[*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar30 * 4)].r;
                    dVar19 = x[*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar30 * 4)].i;
                    dVar18 = pdVar28->i - (temp.r * dVar19 + dVar12 * -dVar11);
                    dVar17.i._0_4_ = SUB84(dVar18,0);
                    dVar17.r = pdVar28->r - (temp.r * dVar12 + dVar19 * dVar11);
                    dVar17.i._4_4_ = (int)((ulong)dVar18 >> 0x20);
                    *pdVar28 = dVar17;
                    pdVar25 = pdVar25 + 2;
                  }
                  fVar36 = fVar36 + (float)((iVar4 - iVar5) * 8);
                  lVar35 = lVar35 + 1;
                }
                fVar36 = fVar36 + (float)((nsupc * 4 + 0xe) * nsupc);
                pdVar28 = (doublecomplex *)((long)iVar29 * 0x10 + local_180);
                if (nsupc == 1) {
                  temp.r = pdVar28->r;
                  temp.i = -pdVar28->i;
                  z_div(x + lVar20,x + lVar20,&temp);
                  lVar33 = lVar33 + 1;
                }
                else {
                  ztrsv_("U",local_160,"N",&nsupc,pdVar28,&nsupr,x + lVar20,&incx);
                  lVar33 = lVar33 + 1;
                }
              }
            }
LAB_00110988:
            stat->ops[0x11] = fVar36 + stat->ops[0x11];
            superlu_free(pdVar28);
            return 0;
          }
        }
      }
      else {
        uVar21 = 3;
        iVar29 = -3;
      }
    }
  }
  else {
    uVar21 = 1;
    iVar29 = -1;
  }
  *info = iVar29;
  temp.r = (double)CONCAT44(temp.r._4_4_,uVar21);
  input_error("sp_ztrsv",(int *)&temp);
  return 0;
}

Assistant:

int
sp_ztrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, doublecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    doublecomplex temp;
    doublecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    doublecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ztrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doublecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ztrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 z_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ztrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    zgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    zlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    zmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			z_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 z_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[fsupc], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ztrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    zusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			zz_mult(&comp_zero, &x[jcol], &Uval[i]);
			z_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			zz_mult(&comp_zero, &x[irow], &Lval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ztrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			zz_mult(&comp_zero, &x[irow], &Uval[i]);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    z_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ztrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        zz_conj(&temp, &Lval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    ZTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ztrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        zz_conj(&temp, &Uval[i]);
			zz_mult(&comp_zero, &x[irow], &temp);
		    	z_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 z_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    zz_conj(&temp, &Lval[luptr]);
		    z_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    ZTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ztrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}